

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

color_quad_u8 __thiscall crnlib::dxt_image::get_pixel(dxt_image *this,uint x,uint y)

{
  dxt5_block *this_00;
  etc1_block *this_01;
  char cVar1;
  byte bVar2;
  undefined1 uVar3;
  long lVar4;
  uint uVar5;
  byte bVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  uint16 uVar9;
  uint16 uVar10;
  undefined2 uVar11;
  uint uVar12;
  uint x_00;
  uint uVar13;
  undefined1 uVar14;
  uint in_ECX;
  uint y_00;
  ulong uVar15;
  color_quad_u8 *pcVar16;
  uint uVar17;
  undefined4 in_register_00000034;
  long lVar18;
  ushort uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  color_quad_u8 c1;
  color_quad_u8 c0;
  
  lVar18 = CONCAT44(in_register_00000034,x);
  uVar5 = y >> 2;
  uVar12 = in_ECX >> 2;
  *(undefined4 *)&(this->m_elements).m_p = 0xff000000;
  x_00 = y & 3;
  y_00 = in_ECX & 3;
  uVar21 = 0;
  do {
    uVar17 = *(uint *)(lVar18 + 0x30);
    if (uVar17 <= uVar21) {
      return (color_quad_u8)SUB84(this,0);
    }
    iVar20 = (int)uVar21;
    switch(*(undefined4 *)(lVar18 + 0x3c + uVar21 * 4)) {
    case 1:
      lVar4 = *(long *)(lVar18 + 0x10);
      uVar15 = (ulong)((*(int *)(lVar18 + 0x20) * uVar12 + uVar5) * uVar17 + iVar20);
      uVar9 = *(uint16 *)(lVar4 + uVar15 * 8);
      uVar10 = *(uint16 *)(lVar4 + 2 + uVar15 * 8);
      dxt1_block::unpack_color((dxt1_block *)&c0,uVar9,true,0xff);
      dxt1_block::unpack_color((dxt1_block *)&c1,uVar10,true,0xff);
      bVar6 = *(byte *)((ulong)y_00 + 4 + lVar4 + uVar15 * 8) >> ((char)y * '\x02' & 6U) & 3;
      if (uVar9 <= uVar10) {
        switch(bVar6) {
        case 0:
          goto switchD_0016e5c6_caseD_0;
        case 1:
          goto switchD_0016e5c6_caseD_1;
        case 2:
          *(char *)&(this->m_elements).m_p =
               (char)((uint)c1.field_0.field_0.r + (uint)c0.field_0.field_0.r >> 1);
          *(char *)((long)&(this->m_elements).m_p + 1) =
               (char)((uint)c1.field_0.field_0.g + (uint)c0.field_0.field_0.g >> 1);
          *(char *)((long)&(this->m_elements).m_p + 2) =
               (char)((uint)c1.field_0.field_0.b + (uint)c0.field_0.field_0.b >> 1);
          break;
        case 3:
          if (*(int *)(lVar18 + 0x44) < 2) {
            *(undefined4 *)&(this->m_elements).m_p = 0;
          }
          else {
            *(undefined2 *)&(this->m_elements).m_p = 0;
            *(undefined1 *)((long)&(this->m_elements).m_p + 2) = 0;
          }
        }
        break;
      }
      switch(bVar6) {
      case 0:
switchD_0016e5c6_caseD_0:
        uVar11 = c0.field_0.m_u32._0_2_;
        uVar14 = c0.field_0.field_0.b;
        break;
      case 1:
switchD_0016e5c6_caseD_1:
        uVar11 = c1.field_0.m_u32._0_2_;
        uVar14 = c1.field_0.field_0.b;
        break;
      case 2:
        uVar7 = (undefined1)(((uint)c1.field_0.field_0.r + (uint)c0.field_0.field_0.r * 2) / 3);
        uVar8 = (undefined1)(((uint)c1.field_0.field_0.g + (uint)c0.field_0.field_0.g * 2) / 3);
        uVar14 = c1.field_0.field_0.b;
        uVar3 = c0.field_0.field_0.b;
        goto LAB_0016e8ad;
      case 3:
        uVar7 = (undefined1)(((uint)c0.field_0.field_0.r + (uint)c1.field_0.field_0.r * 2) / 3);
        uVar8 = (undefined1)(((uint)c0.field_0.field_0.g + (uint)c1.field_0.field_0.g * 2) / 3);
        uVar14 = c0.field_0.field_0.b;
        uVar3 = c1.field_0.field_0.b;
LAB_0016e8ad:
        *(undefined1 *)&(this->m_elements).m_p = uVar7;
        *(undefined1 *)((long)&(this->m_elements).m_p + 1) = uVar8;
        *(char *)((long)&(this->m_elements).m_p + 2) =
             (char)(((uint)(byte)uVar14 + (uint)(byte)uVar3 * 2) / 3);
        goto switchD_0016e544_default;
      }
      *(undefined2 *)&(this->m_elements).m_p = uVar11;
      *(undefined1 *)((long)&(this->m_elements).m_p + 2) = uVar14;
      break;
    case 2:
      cVar1 = *(char *)(lVar18 + 0x38 + uVar21);
      uVar13 = dxt3_block::get_alpha
                         ((dxt3_block *)
                          ((ulong)((*(int *)(lVar18 + 0x20) * uVar12 + uVar5) * uVar17 + iVar20) * 8
                          + *(long *)(lVar18 + 0x10)),x_00,y_00,true);
      this->m_element_component_index[((long)cVar1 & 0xffffffffU) - 0x38] = (int8)uVar13;
      break;
    case 3:
      cVar1 = *(char *)(lVar18 + 0x38 + uVar21);
      this_00 = (dxt5_block *)
                (*(long *)(lVar18 + 0x10) +
                (ulong)((*(int *)(lVar18 + 0x20) * uVar12 + uVar5) * uVar17 + iVar20) * 8);
      bVar6 = this_00->m_endpoints[0];
      bVar2 = this_00->m_endpoints[1];
      uVar17 = (uint)bVar6;
      uVar22 = (uint)bVar2;
      uVar13 = dxt5_block::get_selector(this_00,x_00,y_00);
      uVar15 = (ulong)(uint)(int)cVar1;
      if (bVar2 < bVar6) {
        if (7 < uVar13) break;
        switch(uVar13) {
        case 0:
          goto switchD_0016e67f_caseD_0;
        case 1:
          goto switchD_0016e67f_caseD_1;
        case 2:
          uVar17 = (uint)bVar6 * 6 + (uint)bVar2;
          break;
        case 3:
          uVar17 = uVar17 * 5 + uVar22 * 2;
          break;
        case 4:
          uVar17 = uVar22 * 3 + uVar17 * 4;
          break;
        case 5:
          uVar17 = uVar17 * 3 + uVar22 * 4;
          break;
        case 6:
          uVar17 = uVar22 * 5 + uVar17 * 2;
          break;
        case 7:
          uVar17 = (uint)bVar2 * 6 + (uint)bVar6;
        }
        uVar19 = 7;
        goto LAB_0016e973;
      }
      switch(uVar13) {
      case 0:
switchD_0016e67f_caseD_0:
        this->m_element_component_index[uVar15 - 0x38] = bVar6;
        break;
      case 1:
switchD_0016e67f_caseD_1:
        this->m_element_component_index[uVar15 - 0x38] = bVar2;
        break;
      case 2:
        uVar17 = uVar22 + uVar17 * 4;
        goto LAB_0016e95b;
      case 3:
        uVar17 = uVar17 * 3 + uVar22 * 2;
        goto LAB_0016e95b;
      case 4:
        uVar17 = uVar22 * 3 + uVar17 * 2;
        goto LAB_0016e95b;
      case 5:
        uVar17 = uVar17 + uVar22 * 4;
LAB_0016e95b:
        uVar19 = 5;
LAB_0016e973:
        this->m_element_component_index[uVar15 - 0x38] = (int8)(uVar17 / uVar19);
        break;
      case 6:
        this->m_element_component_index[uVar15 - 0x38] = '\0';
        break;
      case 7:
        this->m_element_component_index[uVar15 - 0x38] = -1;
      }
      break;
    case 4:
      this_01 = (etc1_block *)
                (*(long *)(lVar18 + 0x10) +
                (ulong)((*(int *)(lVar18 + 0x20) * uVar12 + uVar5) * uVar17 + iVar20) * 8);
      bVar6 = (this_01->field_0).m_bytes[3];
      uVar17 = bVar6 >> 2 & 7;
      if ((bVar6 & 2) == 0) {
        uVar9 = etc1_block::get_base4_color(this_01,0);
        etc1_block::get_abs_subblock_colors(&c0,uVar9,(uint)(bVar6 >> 5));
        uVar9 = etc1_block::get_base4_color(this_01,1);
        etc1_block::get_abs_subblock_colors(&c1,uVar9,uVar17);
      }
      else {
        uVar9 = etc1_block::get_base5_color(this_01);
        uVar10 = etc1_block::get_delta3_color(this_01);
        etc1_block::get_diff_subblock_colors(&c0,uVar9,(uint)(bVar6 >> 5));
        etc1_block::get_diff_subblock_colors(&c1,uVar9,uVar10,uVar17);
      }
      uVar13 = etc1_block::get_selector(this_01,x_00,y_00);
      uVar17 = y_00;
      if ((bVar6 & 1) == 0) {
        uVar17 = x_00;
      }
      pcVar16 = &c0;
      if (uVar17 == 3) {
        pcVar16 = &c1;
      }
      *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)&(this->m_elements).m_p =
           pcVar16[uVar13].field_0;
    }
switchD_0016e544_default:
    uVar21 = uVar21 + 1;
  } while( true );
}

Assistant:

color_quad_u8 dxt_image::get_pixel(uint x, uint y) const
    {
        CRNLIB_ASSERT((x < m_width) && (y < m_height));

        const uint block_x = x >> cDXTBlockShift;
        const uint block_y = y >> cDXTBlockShift;

        const element* pElement = reinterpret_cast<const element*>(&get_element(block_x, block_y, 0));

        color_quad_u8 result(0, 0, 0, 255);

        for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
        {
            switch (m_element_type[element_index])
            {
            case cColorETC1:
            {
                const etc1_block& block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));

                const bool diff_flag = block.get_diff_bit();
                const bool flip_flag = block.get_flip_bit();
                const uint table_index0 = block.get_inten_table(0);
                const uint table_index1 = block.get_inten_table(1);
                color_quad_u8 subblock_colors0[4], subblock_colors1[4];

                if (diff_flag)
                {
                    const uint16 base_color5 = block.get_base5_color();
                    const uint16 delta_color3 = block.get_delta3_color();
                    etc1_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);
                    etc1_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1);
                }
                else
                {
                    const uint16 base_color4_0 = block.get_base4_color(0);
                    etc1_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);
                    const uint16 base_color4_1 = block.get_base4_color(1);
                    etc1_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
                }

                const uint bx = x & 3;
                const uint by = y & 3;

                const uint selector_index = block.get_selector(bx, by);
                if (flip_flag)
                {
                    if (by <= 2)
                    {
                        result = subblock_colors0[selector_index];
                    }
                    else
                    {
                        result = subblock_colors1[selector_index];
                    }
                }
                else
                {
                    if (bx > 2)
                    {
                        result = subblock_colors1[selector_index];
                    }
                    else
                    {
                        result = subblock_colors0[selector_index];
                    }
                }

                break;
            }
            case cColorDXT1:
            {
                const dxt1_block* pBlock = reinterpret_cast<const dxt1_block*>(&get_element(block_x, block_y, element_index));

                const uint l = pBlock->get_low_color();
                const uint h = pBlock->get_high_color();

                color_quad_u8 c0(dxt1_block::unpack_color(static_cast<uint16>(l), true));
                color_quad_u8 c1(dxt1_block::unpack_color(static_cast<uint16>(h), true));

                const uint s = pBlock->get_selector(x & 3, y & 3);

                if (l > h)
                {
                    switch (s)
                    {
                    case 0:
                        result.set_noclamp_rgb(c0.r, c0.g, c0.b);
                        break;
                    case 1:
                        result.set_noclamp_rgb(c1.r, c1.g, c1.b);
                        break;
                    case 2:
                        result.set_noclamp_rgb((c0.r * 2 + c1.r) / 3, (c0.g * 2 + c1.g) / 3, (c0.b * 2 + c1.b) / 3);
                        break;
                    case 3:
                        result.set_noclamp_rgb((c1.r * 2 + c0.r) / 3, (c1.g * 2 + c0.g) / 3, (c1.b * 2 + c0.b) / 3);
                        break;
                    }
                }
                else
                {
                    switch (s)
                    {
                    case 0:
                        result.set_noclamp_rgb(c0.r, c0.g, c0.b);
                        break;
                    case 1:
                        result.set_noclamp_rgb(c1.r, c1.g, c1.b);
                        break;
                    case 2:
                        result.set_noclamp_rgb((c0.r + c1.r) >> 1U, (c0.g + c1.g) >> 1U, (c0.b + c1.b) >> 1U);
                        break;
                    case 3:
                    {
                        if (m_format <= cDXT1A)
                        {
                            result.set_noclamp_rgba(0, 0, 0, 0);
                        }
                        else
                        {
                            result.set_noclamp_rgb(0, 0, 0);
                        }
                        break;
                    }
                    }
                }

                break;
            }
            case cAlphaDXT5:
            {
                const int comp_index = m_element_component_index[element_index];

                const dxt5_block* pBlock = reinterpret_cast<const dxt5_block*>(&get_element(block_x, block_y, element_index));

                const uint l = pBlock->get_low_alpha();
                const uint h = pBlock->get_high_alpha();

                const uint s = pBlock->get_selector(x & 3, y & 3);

                if (l > h)
                {
                    switch (s)
                    {
                    case 0:
                        result[comp_index] = static_cast<uint8>(l);
                        break;
                    case 1:
                        result[comp_index] = static_cast<uint8>(h);
                        break;
                    case 2:
                        result[comp_index] = static_cast<uint8>((l * 6 + h) / 7);
                        break;
                    case 3:
                        result[comp_index] = static_cast<uint8>((l * 5 + h * 2) / 7);
                        break;
                    case 4:
                        result[comp_index] = static_cast<uint8>((l * 4 + h * 3) / 7);
                        break;
                    case 5:
                        result[comp_index] = static_cast<uint8>((l * 3 + h * 4) / 7);
                        break;
                    case 6:
                        result[comp_index] = static_cast<uint8>((l * 2 + h * 5) / 7);
                        break;
                    case 7:
                        result[comp_index] = static_cast<uint8>((l + h * 6) / 7);
                        break;
                    }
                }
                else
                {
                    switch (s)
                    {
                    case 0:
                        result[comp_index] = static_cast<uint8>(l);
                        break;
                    case 1:
                        result[comp_index] = static_cast<uint8>(h);
                        break;
                    case 2:
                        result[comp_index] = static_cast<uint8>((l * 4 + h) / 5);
                        break;
                    case 3:
                        result[comp_index] = static_cast<uint8>((l * 3 + h * 2) / 5);
                        break;
                    case 4:
                        result[comp_index] = static_cast<uint8>((l * 2 + h * 3) / 5);
                        break;
                    case 5:
                        result[comp_index] = static_cast<uint8>((l + h * 4) / 5);
                        break;
                    case 6:
                        result[comp_index] = 0;
                        break;
                    case 7:
                        result[comp_index] = 255;
                        break;
                    }
                }

                break;
            }
            case cAlphaDXT3:
            {
                const int comp_index = m_element_component_index[element_index];

                const dxt3_block* pBlock = reinterpret_cast<const dxt3_block*>(&get_element(block_x, block_y, element_index));

                result[comp_index] = static_cast<uint8>(pBlock->get_alpha(x & 3, y & 3, true));

                break;
            }
            default:
                break;
            }
        }

        return result;
    }